

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O3

string * __thiscall
QPDF_String::getUTF8Val_abi_cxx11_(string *__return_storage_ptr__,QPDF_String *this)

{
  bool bVar1;
  
  bVar1 = QUtil::is_utf16(&this->val);
  if (bVar1) {
    QUtil::utf16_to_utf8(__return_storage_ptr__,&this->val);
  }
  else {
    bVar1 = QUtil::is_explicit_utf8(&this->val);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
    }
    else {
      QUtil::pdf_doc_to_utf8(__return_storage_ptr__,&this->val);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF_String::getUTF8Val() const
{
    if (QUtil::is_utf16(this->val)) {
        return QUtil::utf16_to_utf8(this->val);
    } else if (QUtil::is_explicit_utf8(this->val)) {
        // PDF 2.0 allows UTF-8 strings when explicitly prefixed with the three-byte representation
        // of U+FEFF.
        return this->val.substr(3);
    } else {
        return QUtil::pdf_doc_to_utf8(this->val);
    }
}